

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

int nn_global_create_ep(nn_sock *sock,char *addr,int bind)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nn_list_item *pnVar4;
  size_t sVar5;
  nn_list_item *local_60;
  nn_list_item *local_50;
  nn_list_item *it;
  nn_transport *tp;
  size_t protosz;
  char *delim;
  char *proto;
  int rc;
  int bind_local;
  char *addr_local;
  nn_sock *sock_local;
  
  if (addr == (char *)0x0) {
    sock_local._4_4_ = -0x16;
  }
  else {
    sVar2 = strlen(addr);
    if (sVar2 < 0x80) {
      pcVar3 = strchr(addr,0x3a);
      if (pcVar3 == (char *)0x0) {
        sock_local._4_4_ = -0x16;
      }
      else if ((pcVar3[1] == '/') && (pcVar3[2] == '/')) {
        sVar2 = (long)pcVar3 - (long)addr;
        local_50 = nn_list_begin(&self.transports);
        while( true ) {
          it = (nn_list_item *)0x0;
          pnVar4 = nn_list_end(&self.transports);
          if (local_50 == pnVar4) break;
          if (local_50 == (nn_list_item *)0x0) {
            local_60 = (nn_list_item *)0x0;
          }
          else {
            local_60 = (nn_list_item *)&local_50[-4].prev;
          }
          it = local_60;
          sVar5 = strlen((char *)local_60->next);
          if ((sVar5 == sVar2) && (iVar1 = memcmp(local_60->next,addr,sVar2), iVar1 == 0)) break;
          local_50 = nn_list_next(&self.transports,local_50);
        }
        if (it == (nn_list_item *)0x0) {
          sock_local._4_4_ = -0x5d;
        }
        else {
          sock_local._4_4_ = nn_sock_add_ep(sock,(nn_transport *)it,bind,addr + sVar2 + 3);
        }
      }
      else {
        sock_local._4_4_ = -0x16;
      }
    }
    else {
      sock_local._4_4_ = -0x24;
    }
  }
  return sock_local._4_4_;
}

Assistant:

static int nn_global_create_ep (struct nn_sock *sock, const char *addr,
    int bind)
{
    int rc;
    const char *proto;
    const char *delim;
    size_t protosz;
    struct nn_transport *tp;
    struct nn_list_item *it;

    /*  Check whether address is valid. */
    if (!addr)
        return -EINVAL;
    if (strlen (addr) >= NN_SOCKADDR_MAX)
        return -ENAMETOOLONG;

    /*  Separate the protocol and the actual address. */
    proto = addr;
    delim = strchr (addr, ':');
    if (!delim)
        return -EINVAL;
    if (delim [1] != '/' || delim [2] != '/')
        return -EINVAL;
    protosz = delim - addr;
    addr += protosz + 3;

    /*  Find the specified protocol. */
    tp = NULL;
    for (it = nn_list_begin (&self.transports);
          it != nn_list_end (&self.transports);
          it = nn_list_next (&self.transports, it)) {
        tp = nn_cont (it, struct nn_transport, item);
        if (strlen (tp->name) == protosz &&
              memcmp (tp->name, proto, protosz) == 0)
            break;
        tp = NULL;
    }

    /*  The protocol specified doesn't match any known protocol. */
    if (!tp) {
        return -EPROTONOSUPPORT;
    }

    /*  Ask the socket to create the endpoint. */
    rc = nn_sock_add_ep (sock, tp, bind, addr);
    return rc;
}